

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

uint32_t __thiscall cfd::TransactionContext::AddTxIn(TransactionContext *this,OutPoint *outpoint)

{
  uint uVar1;
  uint32_t uVar2;
  Txid *in_RDI;
  TransactionContext *in_stack_ffffffffffffffa8;
  undefined1 local_30 [48];
  
  cfd::core::OutPoint::GetTxid();
  uVar1 = cfd::core::OutPoint::GetVout();
  uVar2 = GetDefaultSequence(in_stack_ffffffffffffffa8);
  uVar2 = cfd::core::Transaction::AddTxIn(in_RDI,(uint)local_30,uVar1,(Script *)(ulong)uVar2);
  core::Txid::~Txid((Txid *)0x3ad065);
  return uVar2;
}

Assistant:

uint32_t TransactionContext::AddTxIn(const OutPoint& outpoint) {
  return AddTxIn(
      outpoint.GetTxid(), outpoint.GetVout(), GetDefaultSequence(),
      Script::Empty);
}